

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * sqlite3KeyInfoAlloc(sqlite3 *db,int N,int X)

{
  int iVar1;
  KeyInfo *p;
  int nExtra;
  int X_local;
  int N_local;
  sqlite3 *db_local;
  
  iVar1 = (N + X) * 9 + -8;
  db_local = (sqlite3 *)sqlite3DbMallocRawNN(db,(long)iVar1 + 0x28);
  if (db_local == (sqlite3 *)0x0) {
    db_local = (sqlite3 *)sqlite3OomFault(db);
  }
  else {
    db_local->mutex = (sqlite3_mutex *)(db_local->aLimit + (long)(N + X) * 2 + -0x1a);
    *(short *)((long)&db_local->pVfs + 6) = (short)N;
    *(short *)&db_local->pVdbe = (short)N + (short)X;
    *(u8 *)((long)&db_local->pVfs + 4) = db->enc;
    db_local->pDfltColl = (CollSeq *)db;
    *(undefined4 *)&db_local->pVfs = 1;
    memset(&db_local->nDb,0,(long)iVar1);
  }
  return (KeyInfo *)db_local;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoAlloc(sqlite3 *db, int N, int X){
  int nExtra = (N+X)*(sizeof(CollSeq*)+1) - sizeof(CollSeq*);
  KeyInfo *p = sqlite3DbMallocRawNN(db, sizeof(KeyInfo) + nExtra);
  if( p ){
    p->aSortFlags = (u8*)&p->aColl[N+X];
    p->nKeyField = (u16)N;
    p->nAllField = (u16)(N+X);
    p->enc = ENC(db);
    p->db = db;
    p->nRef = 1;
    memset(&p[1], 0, nExtra);
  }else{
    return (KeyInfo*)sqlite3OomFault(db);
  }
  return p;
}